

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

array_container_t * array_container_create_range(uint32_t min,uint32_t max)

{
  array_container_t *paVar1;
  uint uVar2;
  ulong uVar3;
  uint16_t *puVar4;
  uint32_t k;
  
  paVar1 = array_container_create_given_capacity((max - min) + 1);
  if ((paVar1 != (array_container_t *)0x0) && (paVar1->cardinality = 0, min < max)) {
    uVar3 = (ulong)paVar1->cardinality;
    puVar4 = paVar1->array + uVar3;
    do {
      *puVar4 = (uint16_t)min;
      min = min + 1;
      puVar4 = puVar4 + 1;
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while (max != min);
    paVar1->cardinality = uVar2;
  }
  return paVar1;
}

Assistant:

array_container_t *array_container_create_range(uint32_t min, uint32_t max) {
    array_container_t *answer =
        array_container_create_given_capacity(max - min + 1);
    if (answer == NULL) return answer;
    answer->cardinality = 0;
    for (uint32_t k = min; k < max; k++) {
        answer->array[answer->cardinality++] = k;
    }
    return answer;
}